

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O1

void mxx::impl::allgather_big<std::pair<int,double>>
               (pair<int,_double> *data,size_t size,pair<int,_double> *out,comm *comm)

{
  datatype dt;
  datatype dt_1;
  datatype local_50;
  datatype local_38;
  
  local_38.mpitype = datatype_builder<std::pair<int,_double>_>::get_type();
  local_38._vptr_datatype = (_func_int **)&PTR__datatype_00152310;
  local_38.builtin = false;
  datatype::contiguous(&local_50,&local_38,size);
  datatype::~datatype(&local_38);
  MPI_Allgather(data,1,local_50.mpitype,out,1,local_50.mpitype,comm->mpi_comm);
  datatype::~datatype(&local_50);
  return;
}

Assistant:

void allgather_big(const T* data, size_t size, T* out, const mxx::comm& comm) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
    MPI_Allgather(const_cast<T*>(data), 1, dt.type(), out, 1, dt.type(), comm);
}